

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::TriangleRenderer
          (TriangleRenderer *this,DeviceInterface *vkd,VkDevice device,Allocator *allocator,
          BinaryCollection *binaryRegistry,
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          *swapchainImages,VkFormat framebufferFormat,UVec2 *renderSize)

{
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *this_00;
  pointer pHVar1;
  Allocation *pAVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Handle<(vk::HandleType)17> HVar8;
  DeviceInterface *pDVar9;
  VkDevice pVVar10;
  VkAllocationCallbacks *pVVar11;
  Handle<(vk::HandleType)18> HVar12;
  VkResult VVar13;
  ProgramBinary *pPVar14;
  Unique<vk::Handle<(vk::HandleType)13>_> *ptr;
  Unique<vk::Handle<(vk::HandleType)23>_> *ptr_00;
  long lVar15;
  ulong uVar16;
  undefined1 local_3b8 [32];
  undefined8 local_398;
  VkSubpassDescription *pVStack_390;
  undefined8 local_388;
  VkSubpassDependency *pVStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  Unique<vk::Handle<(vk::HandleType)18>_> *local_350;
  VkMappedMemoryRange memRange;
  VkSubpassDependency dependencies [2];
  VkAttachmentReference colorAttRef;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_1e8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_1c8;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_1a8;
  VkPipelineColorBlendAttachmentState *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  VkVertexInputBindingDescription vertexBinding0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_158;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D scissor0;
  VkPipelineColorBlendAttachmentState attBlendParams0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  
  this->m_vkd = vkd;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&this->m_swapchainImages,swapchainImages);
  tcu::Vector<unsigned_int,_2>::Vector(&this->m_renderSize,renderSize);
  local_3b8._24_8_ = &rasterParams;
  rasterParams._0_8_ = (ulong)framebufferFormat << 0x20;
  rasterParams.pNext = (void *)0x100000001;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 2;
  rasterParams.rasterizerDiscardEnable = 1;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.cullMode = 0x3b9acdea;
  memRange.size = (VkDeviceSize)&colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  pVStack_390 = (VkSubpassDescription *)&memRange;
  memRange.memory.m_internal = 0;
  memRange.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memRange._4_4_ = 0;
  memRange.pNext = (void *)0x0;
  memRange.offset = 1;
  pVStack_380 = dependencies;
  dependencies[1].dstAccessMask = 0x8000;
  dependencies[1].dependencyFlags = 1;
  dependencies[1].dstSubpass = 0xffffffff;
  dependencies[1].srcStageMask = 0x400;
  dependencies[1].dstStageMask = 0x2000;
  dependencies[1].srcAccessMask = 0x180;
  dependencies[0].srcAccessMask = 0x8000;
  dependencies[0].dstAccessMask = 0x180;
  dependencies[0].dependencyFlags = 1;
  dependencies[1].srcSubpass = 0;
  local_3b8._0_4_ = 0x26;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  dependencies[0].srcSubpass = 0xffffffff;
  dependencies[0].dstSubpass = 0;
  dependencies[0].srcStageMask = 0x2000;
  dependencies[0].dstStageMask = 0x400;
  local_3b8._16_8_ = &DAT_100000000;
  local_398._0_4_ = 1;
  local_388._0_4_ = 2;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_1a8,vkd,device,
             (VkRenderPassCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0);
  pVVar11 = local_1a8.m_data.deleter.m_allocator;
  pVVar10 = local_1a8.m_data.deleter.m_device;
  pDVar9 = local_1a8.m_data.deleter.m_deviceIface;
  HVar8.m_internal = local_1a8.m_data.object.m_internal;
  memRange.memory.m_internal = (deUint64)local_1a8.m_data.deleter.m_device;
  memRange.offset = (VkDeviceSize)local_1a8.m_data.deleter.m_allocator;
  memRange._0_8_ = local_1a8.m_data.object.m_internal;
  memRange.pNext = local_1a8.m_data.deleter.m_deviceIface;
  local_1a8.m_data.object.m_internal = 0;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       pVVar10;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVVar11;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       HVar8.m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       pDVar9;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_1a8);
  dependencies[0].srcStageMask = 4;
  memRange.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  memRange.offset = 0;
  dependencies[0].srcSubpass = 1;
  dependencies[0].dstSubpass = 0;
  memRange.pNext = (void *)0x0;
  memRange.memory.m_internal = 0;
  memRange.size = CONCAT44(memRange.size._4_4_,1);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_3b8,vkd,device,
             (VkPipelineLayoutCreateInfo *)&memRange,(VkAllocationCallbacks *)0x0);
  uVar7 = local_3b8._24_8_;
  uVar6 = local_3b8._16_8_;
  uVar5 = local_3b8._8_8_;
  uVar4 = local_3b8._0_8_;
  memRange.memory.m_internal = local_3b8._16_8_;
  memRange.offset = local_3b8._24_8_;
  memRange._0_8_ = local_3b8._0_8_;
  memRange.pNext = (void *)local_3b8._8_8_;
  local_3b8._0_8_ = (pointer)0x0;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  local_3b8._16_8_ = (VkDevice)0x0;
  local_3b8._24_8_ = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)uVar6;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)uVar7;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       uVar4;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)uVar5;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3b8,"tri-vert",(allocator<char> *)dependencies);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(binaryRegistry,(string *)local_3b8);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&memRange,vkd,device,pPVar14,0);
  local_1c8.m_data.deleter.m_device = (VkDevice)memRange.memory.m_internal;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)memRange.offset;
  local_1c8.m_data.object.m_internal = memRange._0_8_;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)memRange.pNext;
  memRange.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memRange._4_4_ = 0;
  memRange.pNext = (void *)0x0;
  memRange.memory.m_internal = 0;
  memRange.offset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&memRange);
  std::__cxx11::string::~string((string *)local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3b8,"tri-frag",(allocator<char> *)dependencies);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(binaryRegistry,(string *)local_3b8);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&memRange,vkd,device,pPVar14,0);
  local_1e8.m_data.deleter.m_device = (VkDevice)memRange.memory.m_internal;
  local_1e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)memRange.offset;
  local_1e8.m_data.object.m_internal = memRange._0_8_;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)memRange.pNext;
  memRange.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memRange._4_4_ = 0;
  memRange.pNext = (void *)0x0;
  memRange.memory.m_internal = 0;
  memRange.offset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&memRange);
  std::__cxx11::string::~string((string *)local_3b8);
  dependencies[1]._12_8_ = &emptyShaderSpecParams;
  dependencies[0].srcSubpass = 0x12;
  dependencies[0].srcStageMask = 0;
  dependencies[0].dstStageMask = 0;
  emptyShaderSpecParams.dataSize = 0;
  emptyShaderSpecParams.pData = (void *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  dependencies[0].srcAccessMask = 0;
  dependencies[0].dstAccessMask = 1;
  dependencies[0].dependencyFlags = (undefined4)local_1c8.m_data.object.m_internal;
  dependencies[1].srcSubpass = local_1c8.m_data.object.m_internal._4_4_;
  dependencies[1]._4_8_ = (long)"pre_main" + 4;
  dependencies[1].dstAccessMask = 0x12;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  local_3b8._16_8_ = (VkDevice)0x0;
  pVStack_380 = (VkSubpassDependency *)0x0;
  uStack_360 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_398._0_4_ = 0;
  local_398._4_4_ = 0;
  pVStack_390 = (VkSubpassDescription *)0x0;
  local_3b8._0_8_ = (pointer)0x19;
  local_3b8._24_8_ = (VkAllocationCallbacks *)0x700000000;
  local_388._0_4_ = 0;
  local_388._4_4_ = 7;
  local_368 = 7;
  local_358 = 0x3f800000bf800000;
  colorAttRef.attachment = 0x16;
  vertexInputStateParams.vertexAttributeDescriptionCount = 1;
  vertexInputStateParams.pVertexBindingDescriptions = &vertexBinding0;
  vertexBinding0.binding = 0;
  vertexBinding0.stride = 0x10;
  memRange.size = (VkDeviceSize)&vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  vertexBinding0.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  memRange.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  memRange.pNext = (void *)0x0;
  memRange.memory.m_internal = 0x200000000;
  memRange.offset = (VkDeviceSize)dependencies;
  vertexInputStateParams.pVertexAttributeDescriptions = &vertexAttrib0;
  vertexAttrib0.location = 0;
  vertexAttrib0.binding = 0;
  vertexAttrib0.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttrib0.offset = 0;
  local_1a8.m_data.object.m_internal._0_4_ = 0x1a;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x100000003;
  local_188 = &attBlendParams0;
  attBlendParams0.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams0.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams0.alphaBlendOp = VK_BLEND_OP_ADD;
  attBlendParams0.colorWriteMask = 0xf;
  attBlendParams0.blendEnable = 0;
  attBlendParams0.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams0.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams0.colorBlendOp = VK_BLEND_OP_ADD;
  rasterParams.pNext = (void *)0x0;
  rasterParams.depthBiasClamp = 0.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterParams._4_4_ = 0;
  rasterParams.lineWidth = 1.0;
  rasterParams._60_4_ = 0;
  local_180 = 0;
  uStack_178 = 0;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_158,vkd,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&memRange,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_1e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_1c8);
  pVVar11 = local_158.m_data.deleter.m_allocator;
  pVVar10 = local_158.m_data.deleter.m_device;
  pDVar9 = local_158.m_data.deleter.m_deviceIface;
  HVar12.m_internal = local_158.m_data.object.m_internal;
  memRange.memory.m_internal = (deUint64)local_158.m_data.deleter.m_device;
  memRange.offset = (VkDeviceSize)local_158.m_data.deleter.m_allocator;
  memRange._0_8_ = local_158.m_data.object.m_internal;
  memRange.pNext = local_158.m_data.deleter.m_deviceIface;
  local_158.m_data.object.m_internal = 0;
  local_158.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_158.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       pVVar10;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       pVVar11;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       HVar12.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       pDVar9;
  local_350 = &this->m_pipeline;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_158);
  memRange.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  memRange.pNext = (void *)0x0;
  memRange.memory.m_internal = memRange.memory.m_internal & 0xffffffff00000000;
  memRange.offset = 0x30;
  memRange.size = 0x80;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3b8,vkd,device,
                     (VkBufferCreateInfo *)&memRange,(VkAllocationCallbacks *)0x0);
  uVar7 = local_3b8._24_8_;
  uVar6 = local_3b8._16_8_;
  uVar5 = local_3b8._8_8_;
  uVar4 = local_3b8._0_8_;
  memRange.memory.m_internal = local_3b8._16_8_;
  memRange.offset = local_3b8._24_8_;
  memRange._0_8_ = local_3b8._0_8_;
  memRange.pNext = (void *)local_3b8._8_8_;
  local_3b8._0_8_ = (Allocation *)0x0;
  local_3b8._8_8_ = (DeviceInterface *)0x0;
  local_3b8._16_8_ = (VkDevice)0x0;
  local_3b8._24_8_ = (VkAllocationCallbacks *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)uVar6;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uVar7;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       uVar4;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)uVar5;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_3b8);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&memRange,vkd,device,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  (*allocator->_vptr_Allocator[3])(local_3b8,allocator,&memRange,1);
  uVar4 = local_3b8._0_8_;
  local_3b8._0_8_ = (pointer)0x0;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)uVar4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3b8);
  this_00 = &this->m_attachmentViews;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(this_00,(long)(swapchainImages->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(swapchainImages->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::resize(&this->m_framebuffers,
           (long)(swapchainImages->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(swapchainImages->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar15 = 0;
  for (uVar16 = 0;
      pHVar1 = (swapchainImages->
               super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(swapchainImages->
                             super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      uVar16 = uVar16 + 1) {
    ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    memRange.offset = pHVar1[uVar16].m_internal;
    memRange.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    memRange.pNext = (void *)0x0;
    memRange.memory.m_internal = memRange.memory.m_internal & 0xffffffff00000000;
    memRange.size = CONCAT44(framebufferFormat,1);
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3b8,vkd,device,
               (VkImageViewCreateInfo *)&memRange,(VkAllocationCallbacks *)0x0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         (VkDevice)local_3b8._16_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_3b8._24_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_3b8._0_8_
    ;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_3b8._8_8_;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (DeviceInterface *)0x0;
    local_3b8._16_8_ = (VkDevice)0x0;
    local_3b8._24_8_ = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)dependencies,
               ptr);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
               ((long)&((this_00->
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)dependencies);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)dependencies);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_3b8);
    ptr_00 = (Unique<vk::Handle<(vk::HandleType)23>_> *)operator_new(0x20);
    memRange.offset =
         (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
         m_internal;
    rasterParams._0_8_ =
         **(undefined8 **)
           ((long)&((this_00->
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15);
    memRange.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
    memRange.pNext = (void *)0x0;
    memRange.memory.m_internal = memRange.memory.m_internal & 0xffffffff00000000;
    memRange.size = CONCAT44(memRange.size._4_4_,1);
    ::vk::createFramebuffer
              ((Move<vk::Handle<(vk::HandleType)23>_> *)local_3b8,vkd,device,
               (VkFramebufferCreateInfo *)&memRange,(VkAllocationCallbacks *)0x0);
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
         (VkDevice)local_3b8._16_8_;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_3b8._24_8_;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
         local_3b8._0_8_;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_3b8._8_8_;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (DeviceInterface *)0x0;
    local_3b8._16_8_ = (VkDevice)0x0;
    local_3b8._24_8_ = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)dependencies,
               ptr_00);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)
               ((long)&((this->m_framebuffers).
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)dependencies);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)dependencies);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_3b8);
    lVar15 = lVar15 + 0x10;
  }
  pAVar2 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  VVar13 = (*vkd->_vptr_DeviceInterface[0xc])
                     (vkd,device,
                      (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal,(pAVar2->m_memory).m_internal,pAVar2->m_offset);
  ::vk::checkResult(VVar13,
                    "vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x49f);
  memRange.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  memRange.pNext = (void *)0x0;
  pAVar2 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memRange.memory.m_internal = (pAVar2->m_memory).m_internal;
  memRange.offset = pAVar2->m_offset;
  memRange.size = 0xffffffffffffffff;
  puVar3 = (undefined8 *)pAVar2->m_hostPtr;
  *puVar3 = 0xbf000000bf000000;
  puVar3[1] = 0x3f80000000000000;
  puVar3[2] = 0xbf0000003f000000;
  puVar3[3] = 0x3f80000000000000;
  *(undefined4 *)(puVar3 + 4) = 0;
  *(undefined4 *)((long)puVar3 + 0x24) = 0x3f000000;
  *(undefined4 *)(puVar3 + 5) = 0;
  *(undefined4 *)((long)puVar3 + 0x2c) = 0x3f800000;
  VVar13 = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1);
  ::vk::checkResult(VVar13,"vkd.flushMappedMemoryRanges(device, 1u, &memRange)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4b3);
  return;
}

Assistant:

TriangleRenderer::TriangleRenderer (const DeviceInterface&	vkd,
									const VkDevice			device,
									Allocator&				allocator,
									const BinaryCollection&	binaryRegistry,
									const vector<VkImage>	swapchainImages,
									const VkFormat			framebufferFormat,
									const UVec2&			renderSize)
	: m_vkd					(vkd)
	, m_swapchainImages		(swapchainImages)
	, m_renderSize			(renderSize)
	, m_renderPass			(createRenderPass(vkd, device, framebufferFormat))
	, m_pipelineLayout		(createPipelineLayout(vkd, device))
	, m_pipeline			(createPipeline(vkd, device, *m_renderPass, *m_pipelineLayout, binaryRegistry, renderSize))
	, m_vertexBuffer		(createBuffer(vkd, device, (VkDeviceSize)(sizeof(float)*4*3), VK_BUFFER_USAGE_VERTEX_BUFFER_BIT))
	, m_vertexBufferMemory	(allocator.allocate(getBufferMemoryRequirements(vkd, device, *m_vertexBuffer),
							 MemoryRequirement::HostVisible))
{
	m_attachmentViews.resize(swapchainImages.size());
	m_framebuffers.resize(swapchainImages.size());

	for (size_t imageNdx = 0; imageNdx < swapchainImages.size(); ++imageNdx)
	{
		m_attachmentViews[imageNdx]	= ImageViewSp(new Unique<VkImageView>(createAttachmentView(vkd, device, swapchainImages[imageNdx], framebufferFormat)));
		m_framebuffers[imageNdx]	= FramebufferSp(new Unique<VkFramebuffer>(createFramebuffer(vkd, device, *m_renderPass, **m_attachmentViews[imageNdx], renderSize)));
	}

	VK_CHECK(vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset()));

	{
		const VkMappedMemoryRange	memRange	=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,
			m_vertexBufferMemory->getMemory(),
			m_vertexBufferMemory->getOffset(),
			VK_WHOLE_SIZE
		};
		const tcu::Vec4				vertices[]	=
		{
			tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
		};
		DE_STATIC_ASSERT(sizeof(vertices) == sizeof(float)*4*3);

		deMemcpy(m_vertexBufferMemory->getHostPtr(), &vertices[0], sizeof(vertices));
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &memRange));
	}
}